

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket-simpleweb.hh
# Opt level: O0

void __thiscall
discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>>::send
          (WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>> *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  int in_R8D;
  
  WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>::send
            ((WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_> *)
             (this + *(long *)(*(long *)this + -0x20)),in_ESI,in_RDX,in_RCX,in_R8D);
  return;
}

Assistant:

virtual void send(const int opcode, sptr<const json> payload,
                      sptr<const handleSent> callback) override {
        json out{{"op", opcode},
                 {"d", ((payload == nullptr) ? json() : *payload)}};

        log::log(log::debug, [out](std::ostream *log) {
            *log << "Sending: " << out.dump(4) << '\n';
        });

        connection_->send(buildPayload(out), nullptr, 130);
        if (callback != nullptr) {
            (*callback)();
        }
    }